

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O1

void __thiscall CVmObjTads::notify_delete(CVmObjTads *this,int in_root_set)

{
  char *pcVar1;
  void *__ptr;
  
  pcVar1 = (this->super_CVmObject).ext_;
  if (pcVar1 != (char *)0x0) {
    __ptr = *(void **)pcVar1;
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,(this->super_CVmObject).ext_);
    return;
  }
  return;
}

Assistant:

void CVmObjTads::notify_delete(VMG_ int in_root_set)
{
    /* free our extension */
    if (ext_ != 0)
    {
        /* tell the header to delete its memory */
        get_hdr()->free_mem();

        /* delete the extension */
        G_mem->get_var_heap()->free_mem(ext_);
    }
}